

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::setWidget(QMdiSubWindow *this,QWidget *widget)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  bool mod;
  bool bVar6;
  char cVar7;
  QWidget *pQVar8;
  QLayout *this_01;
  QObject *pQVar9;
  Data *pDVar10;
  long lVar11;
  int __sig;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  long local_48;
  QWidgetData *local_38;
  QMdiSubWindow *pQVar12;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (widget == (QWidget *)0x0) {
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
      QMdiSubWindowPrivate::removeBaseWidget(this_00);
      return;
    }
    goto LAB_0044f437;
  }
  pDVar1 = (this_00->baseWidget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = (QWidget *)(this_00->baseWidget).wp.value;
  }
  if (pQVar8 == widget) {
    setWidget();
  }
  else {
    bVar5 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
    QMdiSubWindowPrivate::removeBaseWidget(this_00);
    this_01 = QWidget::layout(&this->super_QWidget);
    if (this_01 == (QLayout *)0x0) {
      QWidget::setParent(widget,&this->super_QWidget);
    }
    else {
      QLayout::addWidget(this_01,widget);
    }
    __sig = 0;
    pQVar9 = (QObject *)qt_qFindChild_helper(widget,0,0,&QSizeGrip::staticMetaObject,1);
    if (pQVar9 != (QObject *)0x0) {
      pQVar12 = this;
      QObject::installEventFilter(pQVar9);
      __sig = (int)pQVar12;
    }
    pDVar1 = (this_00->sizeGrip).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       (pQVar8 = (QWidget *)(this_00->sizeGrip).wp.value, pQVar8 != (QWidget *)0x0)) {
      QWidget::raise(pQVar8,__sig);
    }
    pDVar10 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
    pDVar1 = (this_00->baseWidget).wp.d;
    (this_00->baseWidget).wp.d = pDVar10;
    (this_00->baseWidget).wp.value = &widget->super_QObject;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
      widget = (QWidget *)(this_00->baseWidget).wp.value;
    }
    QObject::installEventFilter(&widget->super_QObject);
    this_00->ignoreWindowTitleChange = true;
    mod = QWidget::isWindowModified(&this->super_QWidget);
    QWidget::windowTitle((QString *)local_58,&this->super_QWidget);
    lVar11 = local_48;
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_58._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    if (lVar11 == 0) {
      QMdiSubWindowPrivate::updateWindowTitle(this_00,true);
      mod = QWidget::isWindowModified((QWidget *)(this_00->baseWidget).wp.value);
    }
    bVar6 = QWidget::isWindowModified(&this->super_QWidget);
    if ((!bVar6) && (mod != false)) {
      QWidget::windowTitle((QString *)local_58,&this->super_QWidget);
      QVar13.m_data = (char *)0x3;
      QVar13.m_size = (qsizetype)local_58;
      lVar11 = QString::indexOf(QVar13,0x665834,CaseInsensitive);
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_58._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      if (lVar11 != -1) {
        QWidget::setWindowModified(&this->super_QWidget,mod);
      }
    }
    QWidget::windowTitle((QString *)local_58,(QWidget *)(this_00->baseWidget).wp.value);
    pQVar2 = &((this_00->lastChildWindowTitle).d.d)->super_QArrayData;
    pcVar3 = (this_00->lastChildWindowTitle).d.ptr;
    (this_00->lastChildWindowTitle).d.d = (Data *)local_58._0_8_;
    (this_00->lastChildWindowTitle).d.ptr = (char16_t *)local_58._8_8_;
    qVar4 = (this_00->lastChildWindowTitle).d.size;
    (this_00->lastChildWindowTitle).d.size = local_48;
    local_58._0_8_ = pQVar2;
    local_58._8_8_ = pcVar3;
    local_48 = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    this_00->ignoreWindowTitleChange = false;
    QWidget::windowIcon((QWidget *)local_58);
    cVar7 = QIcon::isNull();
    if (cVar7 == '\0') {
LAB_0044f3df:
      QIcon::~QIcon((QIcon *)local_58);
    }
    else {
      QWidget::windowIcon((QWidget *)local_60);
      cVar7 = QIcon::isNull();
      QIcon::~QIcon((QIcon *)local_60);
      QIcon::~QIcon((QIcon *)local_58);
      if (cVar7 == '\0') {
        QWidget::windowIcon((QWidget *)local_58);
        QWidget::setWindowIcon(&this->super_QWidget,(QIcon *)local_58);
        goto LAB_0044f3df;
      }
    }
    QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
    if ((!bVar5) && (bVar5 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized), bVar5))
    {
      QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
    }
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0044f437:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::setWidget(QWidget *widget)
{
    Q_D(QMdiSubWindow);
    if (!widget) {
        d->removeBaseWidget();
        return;
    }

    if (Q_UNLIKELY(widget == d->baseWidget)) {
        qWarning("QMdiSubWindow::setWidget: widget is already set");
        return;
    }

    bool wasResized = testAttribute(Qt::WA_Resized);
    d->removeBaseWidget();

    if (QLayout *layout = this->layout())
        layout->addWidget(widget);
    else
        widget->setParent(this);

#if QT_CONFIG(sizegrip)
    QSizeGrip *sizeGrip = widget->findChild<QSizeGrip *>();
    if (sizeGrip)
        sizeGrip->installEventFilter(this);
    if (d->sizeGrip)
        d->sizeGrip->raise();
#endif

    d->baseWidget = widget;
    d->baseWidget->installEventFilter(this);

    d->ignoreWindowTitleChange = true;
    bool isWindowModified = this->isWindowModified();
    if (windowTitle().isEmpty()) {
        d->updateWindowTitle(true);
        isWindowModified = d->baseWidget->isWindowModified();
    }
    if (!this->isWindowModified() && isWindowModified && windowTitle().contains("[*]"_L1))
        setWindowModified(isWindowModified);
    d->lastChildWindowTitle = d->baseWidget->windowTitle();
    d->ignoreWindowTitleChange = false;

    if (windowIcon().isNull() && !d->baseWidget->windowIcon().isNull())
        setWindowIcon(d->baseWidget->windowIcon());

    d->updateGeometryConstraints();
    if (!wasResized && testAttribute(Qt::WA_Resized))
        setAttribute(Qt::WA_Resized, false);
}